

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_object.cpp
# Opt level: O0

gc_heap_ptr<mjs::function_object> __thiscall
mjs::make_raw_function(mjs *this,gc_heap_ptr<mjs::global_object> *global)

{
  undefined8 args_1;
  global_object *pgVar1;
  gc_heap *args;
  function_object *this_00;
  undefined8 extraout_RDX;
  gc_heap_ptr<mjs::function_object> gVar2;
  undefined1 local_68 [24];
  property_attribute attrs;
  version ver;
  undefined1 local_29;
  undefined1 local_28 [8];
  object_ptr fp;
  gc_heap_ptr<mjs::global_object> *global_local;
  gc_heap_ptr<mjs::function_object> *o;
  
  fp.super_gc_heap_ptr_untyped._8_8_ = global;
  pgVar1 = gc_heap_ptr<mjs::global_object>::operator->(global);
  (*(pgVar1->super_object)._vptr_object[0xc])(local_28);
  local_29 = '\0';
  args = gc_heap_ptr_untyped::heap((gc_heap_ptr_untyped *)fp.super_gc_heap_ptr_untyped._8_8_);
  args_1 = fp.super_gc_heap_ptr_untyped._8_8_;
  gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_28);
  object::class_name((object *)&attrs);
  gc_heap::
  make<mjs::function_object,mjs::gc_heap_ptr<mjs::global_object>const&,mjs::string,mjs::gc_heap_ptr<mjs::object>&>
            ((gc_heap *)this,(gc_heap_ptr<mjs::global_object> *)args,(string *)args_1,
             (gc_heap_ptr<mjs::object> *)&attrs);
  string::~string((string *)&attrs);
  pgVar1 = gc_heap_ptr<mjs::global_object>::operator->
                     ((gc_heap_ptr<mjs::global_object> *)fp.super_gc_heap_ptr_untyped._8_8_);
  local_68._20_4_ = global_object::language_version(pgVar1);
  local_68._16_4_ =
       operator|((uint)(local_68._20_4_ != es3) * 2,(uint)(0 < (int)local_68._20_4_) << 2);
  this_00 = gc_heap_ptr<mjs::function_object>::operator->((gc_heap_ptr<mjs::function_object> *)this)
  ;
  gc_heap_ptr<mjs::global_object>::operator->
            ((gc_heap_ptr<mjs::global_object> *)fp.super_gc_heap_ptr_untyped._8_8_);
  global_object::make_object((global_object *)local_68);
  function_object::put_prototype_with_attributes(this_00,(object_ptr *)local_68,local_68._16_4_);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_68);
  local_29 = '\x01';
  gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_28);
  gVar2.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  gVar2.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (gc_heap_ptr<mjs::function_object>)gVar2.super_gc_heap_ptr_untyped;
}

Assistant:

gc_heap_ptr<function_object> make_raw_function(const gc_heap_ptr<global_object>& global) {
    auto fp = global->function_prototype();
    auto o = global.heap().make<function_object>(global, fp->class_name(), fp);
    const auto ver = global->language_version();
    const auto attrs =
        (ver != version::es3 ? property_attribute::dont_enum : property_attribute::none)
        | (ver >= version::es3 ? property_attribute::dont_delete : property_attribute::none);
    o->put_prototype_with_attributes(global->make_object(),  attrs);
    return o;
}